

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

common_sampler * common_sampler_init(llama_model *model,common_params_sampling *params)

{
  common_grammar_trigger_type cVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  undefined4 uVar5;
  long *plVar6;
  llama_sampler *plVar7;
  common_sampler *this;
  undefined8 uVar8;
  long *plVar9;
  size_type *psVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex;
  pointer pbVar12;
  pointer pbVar13;
  common_params_sampling *pcVar14;
  size_type __n;
  undefined8 uVar15;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  pointer pcVar16;
  pointer pcVar17;
  vector<const_char_*,_std::allocator<const_char_*>_> trigger_patterns_c;
  vector<int,_std::allocator<int>_> trigger_tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  trigger_patterns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns_anywhere;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns_at_start;
  string local_158;
  common_params_sampling *local_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  void *local_108;
  iterator iStack_100;
  int *local_f8;
  pointer local_e8;
  undefined8 local_e0;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  llama_model *local_38;
  
  local_38 = model;
  local_e0 = llama_model_get_vocab();
  llama_sampler_chain_default_params();
  local_e8 = (pointer)CONCAT71(local_e8._1_7_,params->no_perf);
  iVar4 = std::__cxx11::string::compare((ulong)&params->grammar,0,(char *)0xb);
  if (iVar4 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
               ,0xa0,"llguidance (cmake -DLLAMA_LLGUIDANCE=ON) is not enabled");
  }
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8 = (int *)0x0;
  local_108 = (void *)0x0;
  iStack_100._M_current = (int *)0x0;
  pcVar16 = (params->grammar_triggers).
            super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (params->grammar_triggers).
           super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_130 = params;
  if (pcVar16 != pcVar2) {
    do {
      cVar1 = pcVar16->type;
      if (cVar1 - COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN < 2) {
        this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78;
        if (cVar1 == COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START) {
          this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,&pcVar16->value);
      }
      else if (cVar1 == COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN) {
        local_158._M_dataplus._M_p._0_4_ = pcVar16->token;
        if (iStack_100._M_current == local_f8) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_108,iStack_100,(int *)&local_158);
        }
        else {
          *iStack_100._M_current = pcVar16->token;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
      }
      else {
        if (cVar1 != COMMON_GRAMMAR_TRIGGER_TYPE_WORD) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                     ,0xbc,"GGML_ASSERT(%s) failed","false && \"unknown trigger type\"");
        }
        regex_escape(&local_158,&pcVar16->value);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar16 = pcVar16 + 1;
    } while (pcVar16 != pcVar2);
  }
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"|","");
    string_join(&local_98,&local_58,&local_d8);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x226359);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_118 = *plVar9;
      lStack_110 = plVar6[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar9;
      local_128 = (long *)*plVar6;
    }
    local_120 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158.field_2._8_8_ = plVar6[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               &local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar15 = local_e0;
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"|","");
    string_join(&local_98,&local_78,&local_d8);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x226365);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_118 = *plVar9;
      lStack_110 = plVar6[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar9;
      local_128 = (long *)*plVar6;
    }
    local_120 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158.field_2._8_8_ = plVar6[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               &local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length = 0;
  local_158.field_2._M_allocated_capacity = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_158,
             (long)local_b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar13 = local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar12 = local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_128 = (long *)(pbVar12->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,(char **)&local_128);
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar13);
  }
  pcVar3 = (local_130->grammar)._M_dataplus._M_p;
  if (local_130->grammar_lazy == false) {
    plVar7 = (llama_sampler *)llama_sampler_init_grammar(uVar15,pcVar3,"root");
  }
  else {
    plVar7 = (llama_sampler *)
             llama_sampler_init_grammar_lazy_patterns
                       (uVar15,pcVar3,"root",local_158._M_dataplus._M_p,
                        (long)(local_158._M_string_length - (long)local_158._M_dataplus._M_p) >> 3,
                        local_108,(long)iStack_100._M_current - (long)local_108 >> 2);
  }
  pcVar14 = local_130;
  if (local_158._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_158._M_dataplus._M_p,
                    local_158.field_2._M_allocated_capacity - (long)local_158._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if (plVar7 == (llama_sampler *)0x0) {
    this = (common_sampler *)0x0;
  }
  else {
    this = (common_sampler *)operator_new(0x1a0);
    common_params_sampling::common_params_sampling((common_params_sampling *)this,pcVar14);
    this->grmr = plVar7;
    plVar7 = (llama_sampler *)llama_sampler_chain_init((ulong)local_e8 & 0xff);
    this->chain = plVar7;
    __n = 0x20;
    if (0x20 < pcVar14->n_prev) {
      __n = (size_type)(uint)pcVar14->n_prev;
    }
    (this->prev).capacity = __n;
    (this->prev).sz = 0;
    (this->prev).first = 0;
    (this->prev).pos = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&(this->prev).data,__n,(allocator_type *)&local_158);
    (this->cur_p).size = 0;
    (this->cur_p).selected = 0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->cur_p).data = (llama_token_data *)0x0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)&(this->cur_p).sorted = 0;
    plVar7 = this->chain;
    uVar5 = llama_vocab_n_tokens(uVar15);
    uVar8 = llama_sampler_init_logit_bias
                      (uVar5,(ulong)((long)(pcVar14->logit_bias).
                                           super__Vector_base<llama_logit_bias,_std::allocator<llama_logit_bias>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pcVar14->logit_bias).
                                          super__Vector_base<llama_logit_bias,_std::allocator<llama_logit_bias>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
    llama_sampler_chain_add(plVar7,uVar8);
    iVar4 = pcVar14->mirostat;
    if (iVar4 == 2) {
      plVar7 = this->chain;
      uVar15 = llama_sampler_init_temp(pcVar14->temp);
      llama_sampler_chain_add(plVar7,uVar15);
      plVar7 = this->chain;
      uVar15 = llama_sampler_init_mirostat_v2
                         (pcVar14->mirostat_tau,pcVar14->mirostat_eta,pcVar14->seed);
    }
    else if (iVar4 == 1) {
      plVar7 = this->chain;
      uVar8 = llama_sampler_init_temp(pcVar14->temp);
      llama_sampler_chain_add(plVar7,uVar8);
      plVar7 = this->chain;
      uVar5 = llama_vocab_n_tokens(uVar15);
      uVar15 = llama_sampler_init_mirostat
                         (pcVar14->mirostat_tau,pcVar14->mirostat_eta,uVar5,pcVar14->seed,100);
    }
    else {
      if (iVar4 != 0) {
        pcVar11 = "false && \"unknown mirostat version\"";
        uVar15 = 0x11f;
LAB_0020f565:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                   ,uVar15,"GGML_ASSERT(%s) failed",pcVar11);
      }
      if (0.0 <= pcVar14->top_n_sigma) {
        plVar7 = this->chain;
        uVar15 = llama_sampler_init_top_k(pcVar14->top_k);
        llama_sampler_chain_add(plVar7,uVar15);
        plVar7 = this->chain;
        uVar15 = llama_sampler_init_temp(pcVar14->temp);
        llama_sampler_chain_add(plVar7,uVar15);
        plVar7 = this->chain;
        uVar15 = llama_sampler_init_top_n_sigma(pcVar14->top_n_sigma);
        llama_sampler_chain_add(plVar7,uVar15);
      }
      else {
        pcVar17 = (pcVar14->samplers).
                  super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_e8 = (pcVar14->samplers).
                   super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (pcVar17 != local_e8) {
          do {
            switch(*pcVar17) {
            case COMMON_SAMPLER_TYPE_DRY:
              local_158._M_dataplus._M_p = (pointer)0x0;
              local_158._M_string_length = 0;
              local_158.field_2._M_allocated_capacity = 0;
              std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_158,
                         (long)(pcVar14->dry_sequence_breakers).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pcVar14->dry_sequence_breakers).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
              pbVar12 = (pcVar14->dry_sequence_breakers).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar13 = (pcVar14->dry_sequence_breakers).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar12;
                  pbVar13 = pbVar13 + 1) {
                local_128 = (long *)(pbVar13->_M_dataplus)._M_p;
                std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                          ((vector<char_const*,std::allocator<char_const*>> *)&local_158,
                           (char **)&local_128);
              }
              plVar7 = this->chain;
              uVar5 = llama_model_n_ctx_train(local_38);
              pcVar14 = local_130;
              uVar15 = llama_sampler_init_dry
                                 (local_130->dry_multiplier,local_130->dry_base,local_e0,uVar5,
                                  local_130->dry_allowed_length,local_130->dry_penalty_last_n,
                                  local_158._M_dataplus._M_p,
                                  (long)(local_158._M_string_length -
                                        (long)local_158._M_dataplus._M_p) >> 3);
              llama_sampler_chain_add(plVar7,uVar15);
              if (local_158._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity -
                                (long)local_158._M_dataplus._M_p);
              }
              goto LAB_0020f35b;
            case COMMON_SAMPLER_TYPE_TOP_K:
              plVar7 = this->chain;
              uVar15 = llama_sampler_init_top_k(pcVar14->top_k);
              break;
            case COMMON_SAMPLER_TYPE_TOP_P:
              plVar7 = this->chain;
              uVar15 = llama_sampler_init_top_p(pcVar14->top_p,(long)pcVar14->min_keep);
              break;
            case COMMON_SAMPLER_TYPE_MIN_P:
              plVar7 = this->chain;
              uVar15 = llama_sampler_init_min_p(pcVar14->min_p,(long)pcVar14->min_keep);
              break;
            default:
              pcVar11 = "false && \"unknown sampler type\"";
              uVar15 = 0x113;
              goto LAB_0020f565;
            case COMMON_SAMPLER_TYPE_TYPICAL_P:
              plVar7 = this->chain;
              uVar15 = llama_sampler_init_typical(pcVar14->typ_p,(long)pcVar14->min_keep);
              break;
            case COMMON_SAMPLER_TYPE_TEMPERATURE:
              plVar7 = this->chain;
              uVar15 = llama_sampler_init_temp_ext
                                 (pcVar14->temp,pcVar14->dynatemp_range,pcVar14->dynatemp_exponent);
              break;
            case COMMON_SAMPLER_TYPE_XTC:
              plVar7 = this->chain;
              uVar15 = llama_sampler_init_xtc
                                 (pcVar14->xtc_probability,pcVar14->xtc_threshold,
                                  (long)pcVar14->min_keep,pcVar14->seed);
              break;
            case COMMON_SAMPLER_TYPE_INFILL:
              plVar7 = this->chain;
              uVar15 = llama_sampler_init_infill(local_e0);
              break;
            case COMMON_SAMPLER_TYPE_PENALTIES:
              plVar7 = this->chain;
              uVar15 = llama_sampler_init_penalties
                                 (pcVar14->penalty_repeat,pcVar14->penalty_freq,
                                  pcVar14->penalty_present,pcVar14->penalty_last_n);
            }
            llama_sampler_chain_add(plVar7,uVar15);
LAB_0020f35b:
            pcVar17 = pcVar17 + 1;
          } while (pcVar17 != local_e8);
        }
      }
      plVar7 = this->chain;
      uVar15 = llama_sampler_init_dist(pcVar14->seed);
    }
    llama_sampler_chain_add(plVar7,uVar15);
  }
  return this;
}

Assistant:

struct common_sampler * common_sampler_init(const struct llama_model * model, const struct common_params_sampling & params) {
    const llama_vocab * vocab = llama_model_get_vocab(model);

    llama_sampler_chain_params lparams = llama_sampler_chain_default_params();

    lparams.no_perf = params.no_perf;

    struct llama_sampler * grmr;
    if (params.grammar.compare(0, 11, "%llguidance") == 0) {
#ifdef LLAMA_USE_LLGUIDANCE
        grmr = llama_sampler_init_llg(vocab, "lark", params.grammar.c_str());
#else
        GGML_ABORT("llguidance (cmake -DLLAMA_LLGUIDANCE=ON) is not enabled");
#endif // LLAMA_USE_LLGUIDANCE
    } else {
        std::vector<std::string> patterns_at_start;
        std::vector<std::string> patterns_anywhere;
        std::vector<llama_token> trigger_tokens;
        for (const auto & trigger : params.grammar_triggers) {
            switch (trigger.type) {
                case COMMON_GRAMMAR_TRIGGER_TYPE_WORD:
                {
                    const auto & word = trigger.value;
                    patterns_anywhere.push_back(regex_escape(word));
                    break;
                }
                case COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN:
                case COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START:
                {
                    const auto & pattern = trigger.value;
                    (trigger.type == COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START ? patterns_at_start : patterns_anywhere).push_back(pattern);
                    break;
                }
                case COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN:
                {
                    const auto token = trigger.token;
                    trigger_tokens.push_back(token);
                    break;
                }
                default:
                    GGML_ASSERT(false && "unknown trigger type");
            }
        }

        std::vector<std::string> trigger_patterns;
        if (!patterns_at_start.empty()) {
            trigger_patterns.push_back("^(" + string_join(patterns_at_start, "|") + ")[\\s\\S]*");
        }
        if (!patterns_anywhere.empty()) {
            trigger_patterns.push_back("^[\\s\\S]*?(" + string_join(patterns_anywhere, "|") + ")[\\s\\S]*");
        }

        std::vector<const char *> trigger_patterns_c;
        trigger_patterns_c.reserve(trigger_patterns.size());
        for (const auto & regex : trigger_patterns) {
            trigger_patterns_c.push_back(regex.c_str());
        }

        grmr = params.grammar_lazy
             ? llama_sampler_init_grammar_lazy_patterns(vocab, params.grammar.c_str(), "root",
                                                        trigger_patterns_c.data(), trigger_patterns_c.size(),
                                                        trigger_tokens.data(), trigger_tokens.size())
             :      llama_sampler_init_grammar(vocab, params.grammar.c_str(), "root");
        if (!grmr) {
            return nullptr;
        }
    }

    auto * result = new common_sampler {
        /* .params = */ params,
        /* .grmr   = */ grmr,
        /* .chain  = */ llama_sampler_chain_init(lparams),
        /* .prev   = */ ring_buffer<llama_token>(std::max(32, params.n_prev)),
        /* .cur    = */ {},
        /* .cur_p  = */ {},
    };

    llama_sampler_chain_add(result->chain,
            llama_sampler_init_logit_bias(
                llama_vocab_n_tokens(vocab),
                params.logit_bias.size(),
                params.logit_bias.data()));

    if (params.mirostat == 0) {
        if (params.top_n_sigma >= 0) {
            llama_sampler_chain_add(result->chain, llama_sampler_init_top_k        (params.top_k));
            llama_sampler_chain_add(result->chain, llama_sampler_init_temp         (params.temp));
            llama_sampler_chain_add(result->chain, llama_sampler_init_top_n_sigma  (params.top_n_sigma));
        } else {
            for (const auto & cnstr : params.samplers) {
                switch (cnstr) {
                    case COMMON_SAMPLER_TYPE_DRY:
                        {
                            std::vector<const char *> c_breakers;
                            c_breakers.reserve(params.dry_sequence_breakers.size());
                            for (const auto & str : params.dry_sequence_breakers) {
                                c_breakers.push_back(str.c_str());
                            }

                            llama_sampler_chain_add(result->chain, llama_sampler_init_dry      (vocab, llama_model_n_ctx_train(model), params.dry_multiplier, params.dry_base, params.dry_allowed_length, params.dry_penalty_last_n, c_breakers.data(), c_breakers.size()));
                        }
                        break;
                    case COMMON_SAMPLER_TYPE_TOP_K:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_top_k    (params.top_k));
                        break;
                    case COMMON_SAMPLER_TYPE_TOP_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_top_p    (params.top_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_MIN_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_min_p    (params.min_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_XTC:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_xtc      (params.xtc_probability, params.xtc_threshold, params.min_keep, params.seed));
                        break;
                    case COMMON_SAMPLER_TYPE_TYPICAL_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_typical  (params.typ_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_TEMPERATURE:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_temp_ext (params.temp, params.dynatemp_range, params.dynatemp_exponent));
                        break;
                    case COMMON_SAMPLER_TYPE_INFILL:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_infill   (vocab));
                        break;
                    case COMMON_SAMPLER_TYPE_PENALTIES:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_penalties(params.penalty_last_n, params.penalty_repeat, params.penalty_freq, params.penalty_present));
                        break;
                    default:
                        GGML_ASSERT(false && "unknown sampler type");
                }
            }
        }
        llama_sampler_chain_add(result->chain, llama_sampler_init_dist(params.seed));
    } else if (params.mirostat == 1) {
        llama_sampler_chain_add(result->chain, llama_sampler_init_temp(params.temp));
        llama_sampler_chain_add(result->chain, llama_sampler_init_mirostat(llama_vocab_n_tokens(vocab), params.seed, params.mirostat_tau, params.mirostat_eta, 100));
    } else if (params.mirostat == 2) {
        llama_sampler_chain_add(result->chain, llama_sampler_init_temp(params.temp));
        llama_sampler_chain_add(result->chain, llama_sampler_init_mirostat_v2(params.seed, params.mirostat_tau, params.mirostat_eta));
    } else {
        GGML_ASSERT(false && "unknown mirostat version");
    }

    return result;
}